

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void PSG_setFlags(PSG_conflict *psg,UINT8 flags)

{
  psg->stereo_mask[0] = (uint)(-1 < (char)flags) * 2 + 1;
  psg->stereo_mask[1] = 3;
  psg->stereo_mask[2] = -1 < (char)flags | 2;
  return;
}

Assistant:

EMU2149_API void
PSG_setFlags (PSG * psg, UINT8 flags)
{
	if (flags & EMU2149_ZX_STEREO)
	{
		/* ABC Stereo */
		psg->stereo_mask[0] = 0x01;
		psg->stereo_mask[1] = 0x03;
		psg->stereo_mask[2] = 0x02;
	}
	else
	{
		psg->stereo_mask[0] = 0x03;
		psg->stereo_mask[1] = 0x03;
		psg->stereo_mask[2] = 0x03;
	}

	return;
}